

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O2

LY_ERR ly_out_reset(ly_out *out)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  __off_t _Var5;
  char *pcVar6;
  char *format;
  LY_ERR LVar7;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_reset");
    return LY_EINVAL;
  }
  LVar7 = LY_SUCCESS;
  switch(out->type) {
  case LY_OUT_FD:
    _Var5 = lseek((out->method).fd,0,0);
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    if (_Var5 == -1) {
      if (iVar3 == 0x1d) {
        return LY_SUCCESS;
      }
      pcVar6 = strerror(iVar3);
      format = "Seeking output file descriptor failed (%s).";
    }
    else {
      if (iVar3 == 0x1d) {
        return LY_SUCCESS;
      }
      iVar3 = (out->method).fd;
LAB_00138d7f:
      iVar3 = ftruncate(iVar3,0);
      if (iVar3 != -1) {
        return LY_SUCCESS;
      }
      pcVar6 = strerror(*piVar4);
      format = "Truncating output file failed (%s).";
    }
    goto LAB_00138dd5;
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    iVar2 = fseek((FILE *)(out->method).f,0,0);
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    if (iVar2 != -1) {
      if (iVar3 == 0x1d) {
        return LY_SUCCESS;
      }
      iVar3 = fileno((FILE *)(out->method).f);
      goto LAB_00138d7f;
    }
    if (iVar3 == 0x1d) {
      return LY_SUCCESS;
    }
    pcVar6 = strerror(iVar3);
    format = "Seeking output file stream failed (%s).";
LAB_00138dd5:
    LVar7 = LY_ESYS;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,format,pcVar6);
    break;
  case LY_OUT_MEMORY:
    ppcVar1 = (out->method).mem.buf;
    if ((ppcVar1 != (char **)0x0) && (pcVar6 = *ppcVar1, pcVar6 != (char *)0x0)) {
      memset(pcVar6,0,(out->method).mem.len);
    }
    out->printed = 0;
    (out->method).fpath.filepath = (char *)0x0;
    LVar7 = LY_SUCCESS;
    break;
  case LY_OUT_ERROR:
    LVar7 = LY_EINT;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x131);
  }
  return LVar7;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_reset(struct ly_out *out)
{
    LY_CHECK_ARG_RET(NULL, out, LY_EINVAL);

    switch (out->type) {
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    case LY_OUT_FD:
        if ((lseek(out->method.fd, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file descriptor failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(out->method.fd, 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILE:
    case LY_OUT_FILEPATH:
        if ((fseek(out->method.f, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file stream failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(fileno(out->method.f), 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_MEMORY:
        if (out->method.mem.buf && *out->method.mem.buf) {
            memset(*out->method.mem.buf, 0, out->method.mem.len);
        }
        out->printed = 0;
        out->method.mem.len = 0;
        break;
    case LY_OUT_CALLBACK:
        /* nothing to do (not seekable) */
        break;
    }

    return LY_SUCCESS;
}